

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

enable_if_t<_Traits::isStreamWriter<const_char_*>::value,_Domain_&> __thiscall
Scine::Core::Log::Domain::operator<<(Domain *this,char **t)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  *__range3;
  __node_base *p_Var1;
  
  p_Var1 = &(this->sinks_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::operator<<((ostream *)p_Var1[5]._M_nxt,*t);
  }
  return this;
}

Assistant:

std::enable_if_t<!Traits::isStreamWriter<T>::value, Domain&> operator<<(T&& t) {
      for (auto& nameSinkPair : sinks_) {
        *nameSinkPair.second << t;
      }
      return *this;
    }